

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::Station(Station *this,Station *s)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  const_iterator cVar6;
  mapped_type *ppMVar7;
  Matrix local_78;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_68;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *local_60;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_48;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *local_40;
  Matrix *local_38;
  
  this->_vptr_Station = (_func_int **)&PTR__Station_00132d58;
  p_Var1 = &(this->D)._M_t._M_impl.super__Rb_tree_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = &this->A;
  local_48 = &this->last_diff;
  (this->A).
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->A).
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->last_mem).second.first = 0;
  (this->last_mem).second.second = 0;
  (this->A).
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->last_mem).first.first = 0;
  (this->last_mem).first.second = 0;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)local_48;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)local_48;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->collimator = s->collimator;
  local_38 = &this->I;
  maths::Matrix::Matrix(local_38);
  local_50 = &this->intensity;
  (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = &this->pos2beam;
  p_Var1 = &(this->pos2beam)._M_t._M_impl.super__Rb_tree_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->beam2pos)._M_t._M_impl.super__Rb_tree_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->int2nb)._M_t._M_impl.super__Rb_tree_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = &this->beam2pos;
  local_68 = &this->int2nb;
  Collimator::operator=(this->collimator,s->collimator);
  this->angle = s->angle;
  iVar5 = s->max_intensity;
  iVar3 = s->min_intensity;
  iVar4 = s->initial_intensity;
  this->max_apertures = s->max_apertures;
  this->max_intensity = iVar5;
  this->min_intensity = iVar3;
  this->initial_intensity = iVar4;
  this->step_intensity = s->step_intensity;
  iVar5 = s->n_volumes;
  this->n_volumes = iVar5;
  for (local_78.rows_ = 0; local_78.rows_ < iVar5; local_78.rows_ = local_78.rows_ + 1) {
    cVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_const_maths::Matrix_*>,_std::_Select1st<std::pair<const_int,_const_maths::Matrix_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
            ::find(&(s->D)._M_t,&local_78.rows_);
    p_Var2 = cVar6._M_node[1]._M_parent;
    ppMVar7 = std::
              map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
              ::operator[](&this->D,&local_78.rows_);
    *ppMVar7 = (mapped_type)p_Var2;
    iVar5 = this->n_volumes;
  }
  maths::Matrix::Matrix(&local_78,&s->I);
  maths::Matrix::operator=(local_38,&local_78);
  maths::Matrix::~Matrix(&local_78);
  std::vector<double,_std::allocator<double>_>::operator=(local_50,&s->intensity);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::operator=(local_40,&s->A);
  (this->last_mem).first = (s->last_mem).first;
  (this->last_mem).second = (s->last_mem).second;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            (local_48,&s->last_diff);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::operator=(&local_58->_M_t,&(s->pos2beam)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::operator=(&local_60->_M_t,&(s->beam2pos)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&local_68->_M_t,&(s->int2nb)._M_t);
  return;
}

Assistant:

Station::Station(const Station &s): collimator(s.collimator){
    collimator=s.collimator;
    angle=s.angle;
    max_apertures=s.max_apertures;
    max_intensity=s.max_intensity;
    min_intensity=s.min_intensity;
    initial_intensity=s.initial_intensity;
    step_intensity=s.step_intensity;
    n_volumes=s.n_volumes;
    for (int i=0; i<n_volumes; i++){
      const Matrix * aux= s.D.find(i)->second;
      D[i]=aux;
    }
    //I=s.I;
    I= Matrix (s.I);
    intensity=s.intensity;
    A=s.A;
    last_mem=s.last_mem;
    last_diff=s.last_diff;
    pos2beam=s.pos2beam;
    beam2pos=s.beam2pos;
    int2nb=s.int2nb;
  }